

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupDestinationRecord.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::GroupDestinationRecord::IsGroupBitSet(GroupDestinationRecord *this,KUINT8 Group)

{
  KException *this_00;
  KString local_40;
  
  if (Group < 0x20) {
    return (this->m_ui32GrpBtField & (uint)(1L << (Group & 0x3f))) != 0;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"IsGroupBitSet","");
  KException::KException(this_00,&local_40,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

KBOOL GroupDestinationRecord::IsGroupBitSet(KUINT8 Group) const noexcept(false)
{
    if( Group > 31 )throw KException( __FUNCTION__, OUT_OF_BOUNDS );

    const bitset<32> bits( ( KINT32 )m_ui32GrpBtField ); // We need to cast to a signed int, this is a visual studio 2010 fix
    return bits.test( Group );
}